

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **argv)

{
  char *pcVar1;
  istream *this;
  ostream *poVar2;
  double dVar3;
  rep_conflict rVar4;
  undefined1 local_700 [8];
  fstream timing_file;
  ostream local_6f0 [512];
  undefined1 local_4f0 [8];
  fstream output_file;
  ostream local_4e0 [512];
  duration<long,_std::ratio<1L,_1000000000L>_> local_2e0;
  duration<double,_std::ratio<1L,_1L>_> local_2d8;
  duration<double,_std::ratio<1L,_1L>_> elapsed_time;
  time_point end_time;
  double error;
  time_point start_time;
  int nt;
  int nx;
  fstream input_file;
  allocator<char> local_99;
  string local_98 [8];
  string timing_file_name;
  string local_70 [8];
  string output_file_name;
  allocator<char> local_39;
  string local_38 [8];
  string input_file_name;
  char **argv_local;
  int param_0_local;
  
  input_file_name.field_2._8_8_ = argv;
  std::ios_base::sync_with_stdio(false);
  pcVar1 = *(char **)(input_file_name.field_2._8_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = *(char **)(input_file_name.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar1,(allocator<char> *)(timing_file_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(timing_file_name.field_2._M_local_buf + 0xf))
  ;
  pcVar1 = *(char **)(input_file_name.field_2._8_8_ + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,pcVar1,&local_99);
  std::allocator<char>::~allocator(&local_99);
  std::fstream::fstream(&nt,local_38,_S_in);
  this = (istream *)std::istream::operator>>((istream *)&nt,(int *)((long)&start_time.__d.__r + 4));
  std::istream::operator>>(this,(int *)&start_time);
  error = (double)std::chrono::_V2::system_clock::now();
  dVar3 = solve_problem(start_time.__d.__r._4_4_,(int)start_time.__d.__r);
  elapsed_time.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
  local_2e0.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&elapsed_time,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&error);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_2d8,&local_2e0);
  std::fstream::fstream(local_4f0,local_70,_S_out);
  poVar2 = (ostream *)std::ostream::operator<<(local_4e0,dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::fstream::fstream(local_700,local_98,_S_out);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_2d8);
  poVar2 = (ostream *)std::ostream::operator<<(local_6f0,rVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::fstream::~fstream(local_700);
  std::fstream::~fstream(local_4f0);
  std::fstream::~fstream(&nt);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int, char** argv)
{
    std::ios_base::sync_with_stdio(false);

    std::string input_file_name(argv[1]);
    std::string output_file_name(argv[2]);
    std::string timing_file_name(argv[3]);

    std::fstream input_file(input_file_name, std::ios::in);
    int nx, nt;
    input_file >> nx >> nt;

    auto start_time = std::chrono::high_resolution_clock::now();
    double error = solve_problem(nx, nt);
    auto end_time = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double> elapsed_time = end_time - start_time;

    std::fstream output_file(output_file_name, std::ios::out);
    output_file << error << std::endl;

    std::fstream timing_file(timing_file_name, std::ios::out);
    timing_file << elapsed_time.count() << std::endl;

    return 0;
}